

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<RestorePoint>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,RestorePoint *value)

{
  LPCWSTR pWVar1;
  Type TVar2;
  _func_int **pp_Var3;
  LPCWSTR pWVar4;
  Type TVar5;
  undefined4 uVar6;
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar7;
  
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x50,this->alloc,0x35916e);
  value_00->clue = clue;
  value_00->offset = 0xffffffff;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a420;
  pWVar1 = (LPCWSTR)value->m_cMinTokMultiUnits;
  TVar2 = value->m_cMinLineMultiUnits;
  pp_Var3 = *(_func_int ***)&value->m_line;
  pWVar4 = (LPCWSTR)value->lengthDecr;
  TVar5 = value->m_fHadEol;
  uVar6 = *(undefined4 *)&value->field_0x2c;
  value_00[1]._vptr_BufferBuilder = *(_func_int ***)value;
  value_00[1].clue = pWVar1;
  *(Type *)&value_00[1].offset = TVar2;
  value_00[2]._vptr_BufferBuilder = pp_Var3;
  value_00[2].clue = pWVar4;
  value_00[2].offset = TVar5;
  *(undefined4 *)&value_00[2].field_0x14 = uVar6;
  value_00[3]._vptr_BufferBuilder = (_func_int **)value->m_cMultiUnits;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a400;
  pIVar7 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend(builder->list,value_00,this->alloc);
  builder->list = pIVar7;
  return 0x38;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }